

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_CREATE_ARROWS(effect_handler_context_t_conflict *context)

{
  loc_conflict grid;
  chunk_conflict *c;
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  _Bool local_4f;
  byte local_4e;
  byte local_4d;
  undefined4 local_4c;
  _Bool none_left;
  _Bool great;
  _Bool good;
  char *pcStack_48;
  wchar_t itemmode;
  char *s;
  char *q;
  object *arrows;
  object *staff;
  object *obj;
  effect_handler_context_t_conflict *peStack_18;
  wchar_t lev;
  effect_handler_context_t_conflict *context_local;
  
  local_4c = 6;
  local_4d = 0;
  local_4e = 0;
  local_4f = false;
  s = "Make arrows from which staff? ";
  pcStack_48 = "You have no staff to use.";
  peStack_18 = context;
  if (context->cmd == (command_conflict *)0x0) {
    _Var1 = get_item(&staff,"Make arrows from which staff? ","You have no staff to use.",CMD_NULL,
                     tval_is_staff,L'\x06');
    if (!_Var1) {
      return false;
    }
  }
  else {
    wVar2 = cmd_get_item((command *)context->cmd,"tgtitem",&staff,"Make arrows from which staff? ",
                         "You have no staff to use.",tval_is_staff,L'\x06');
    if (wVar2 != L'\0') {
      return false;
    }
  }
  obj._4_4_ = staff->kind->level;
  uVar3 = Rand_div(obj._4_4_);
  if (0x19 < (int)(uVar3 + 1)) {
    local_4d = 1;
    uVar3 = Rand_div(obj._4_4_);
    if (0x32 < (int)(uVar3 + 1)) {
      local_4e = 1;
    }
  }
  _Var1 = object_is_carried(player,staff);
  if (_Var1) {
    arrows = gear_object_for_use(player,staff,L'\x01',true,&local_4f);
  }
  else {
    arrows = floor_object_for_use(player,staff,L'\x01',true,&local_4f);
  }
  if (arrows->known != (object *)0x0) {
    object_delete((chunk *)player->cave,(chunk *)0x0,&arrows->known);
  }
  object_delete((chunk *)cave,(chunk *)player->cave,&arrows);
  c = cave;
  wVar2 = eff_level(player);
  q = (char *)make_object((chunk *)c,wVar2,(_Bool)(local_4d & 1),(_Bool)(local_4e & 1),false,
                          (int32_t *)0x0,L'\x03');
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  drop_near((chunk *)cave,(object **)&q,L'\0',grid,true,true);
  return true;
}

Assistant:

bool effect_handler_CREATE_ARROWS(effect_handler_context_t *context)
{
	int lev;
	struct object *obj, *staff, *arrows;
	const char *q, *s;
	int itemmode = (USE_INVEN | USE_FLOOR);
	bool good = false, great = false;
	bool none_left = false;

	/* Get an item */
	q = "Make arrows from which staff? ";
	s = "You have no staff to use.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				tval_is_staff, itemmode)) {
			return false;
		}
	} else if (!get_item(&obj, q, s, 0, tval_is_staff, itemmode)) {
		return false;
	}

	/* Extract the object "level" */
	lev = obj->kind->level;

	/* Roll for good */
	if (randint1(lev) > 25) {
		good = true;
		/* Roll for great */
		if (randint1(lev) > 50) {
			great = true;
		}
	}

	/* Destroy the staff */
	if (object_is_carried(player, obj)) {
		staff = gear_object_for_use(player, obj, 1, true, &none_left);
	} else {
		staff = floor_object_for_use(player, obj, 1, true, &none_left);
	}

	if (staff->known) {
		object_delete(player->cave, NULL, &staff->known);
	}
	object_delete(cave, player->cave, &staff);

	/* Make some arrows */
	arrows = make_object(cave, eff_level(player), good, great, false, NULL,
						 TV_ARROW);
	drop_near(cave, &arrows, 0, player->grid, true, true);

	return true;
}